

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManReadInstance(Prs_Man_t *p,int Func)

{
  int iVar1;
  int iVar2;
  char *pName;
  int local_24;
  int iFuncNew;
  int Status;
  int InstId;
  int Func_local;
  Prs_Man_t *p_local;
  
  iVar1 = Prs_ManUtilSkipSpaces(p);
  if (iVar1 == 0) {
    iVar1 = Prs_ManIsChar(p,'#');
    if (iVar1 != 0) {
      p->pCur = p->pCur + 1;
      while (iVar1 = Prs_ManIsDigit(p), iVar1 != 0) {
        p->pCur = p->pCur + 1;
      }
      iVar1 = Prs_ManUtilSkipSpaces(p);
      if (iVar1 != 0) {
        iVar1 = Prs_ManErrorSet(p,"Error number 25.",0);
        return iVar1;
      }
    }
    iVar1 = Prs_ManReadName(p);
    if ((iVar1 == 0) || (iVar2 = Prs_ManUtilSkipSpaces(p), iVar2 == 0)) {
      iVar2 = Prs_ManIsChar(p,'(');
      if (iVar2 == 0) {
        p_local._4_4_ = Prs_ManErrorSet(p,"Expecting \"(\" in module instantiation.",0);
      }
      else {
        p->pCur = p->pCur + 1;
        iVar2 = Prs_ManUtilSkipSpaces(p);
        if (iVar2 == 0) {
          iVar2 = Prs_ManIsChar(p,'.');
          if (iVar2 == 0) {
            pName = Abc_NamStr(p->pStrs,Func);
            Status = Prs_ManIsVerilogPrim(pName);
            if (Status == 0) {
              iVar1 = Prs_ManErrorSet(p,"Cannot find elementary gate.",0);
              return iVar1;
            }
            local_24 = Prs_ManReadSignalList(p,&p->vTemp,')',1);
          }
          else {
            local_24 = Prs_ManReadSignalList2(p,&p->vTemp);
            Status = Func;
          }
          if (local_24 == 0) {
            p_local._4_4_ = Prs_ManErrorSet(p,"Error number 28.",0);
          }
          else {
            iVar2 = Prs_ManIsChar(p,')');
            if (iVar2 == 0) {
              __assert_fail("Prs_ManIsChar(p, \')\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                            ,0x46a,"int Prs_ManReadInstance(Prs_Man_t *, int)");
            }
            p->pCur = p->pCur + 1;
            iVar2 = Prs_ManUtilSkipSpaces(p);
            if (iVar2 == 0) {
              iVar2 = Prs_ManIsChar(p,';');
              if (iVar2 == 0) {
                p_local._4_4_ = Prs_ManErrorSet(p,"Expecting semicolon in the instance.",0);
              }
              else {
                Prs_NtkAddBox(p->pNtk,Status,iVar1,&p->vTemp);
                p_local._4_4_ = 1;
              }
            }
            else {
              p_local._4_4_ = Prs_ManErrorSet(p,"Error number 29.",0);
            }
          }
        }
        else {
          p_local._4_4_ = Prs_ManErrorSet(p,"Error number 27.",0);
        }
      }
    }
    else {
      p_local._4_4_ = Prs_ManErrorSet(p,"Error number 26.",0);
    }
  }
  else {
    p_local._4_4_ = Prs_ManErrorSet(p,"Error number 25.",0);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Prs_ManReadInstance( Prs_Man_t * p, int Func )
{
    int InstId, Status;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 25.", 0);
    if ( Prs_ManIsChar(p, '#') )
    {
        p->pCur++;
        while ( Prs_ManIsDigit(p) )
            p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 25.", 0);
    }
    if ( (InstId = Prs_ManReadName(p)) )
        if (Prs_ManUtilSkipSpaces(p))       return Prs_ManErrorSet(p, "Error number 26.", 0);
    if ( !Prs_ManIsChar(p, '(') )           return Prs_ManErrorSet(p, "Expecting \"(\" in module instantiation.", 0);
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 27.", 0);
    if ( Prs_ManIsChar(p, '.') ) // box
        Status = Prs_ManReadSignalList2(p, &p->vTemp);
    else  // node
    {
        //char * s = Abc_NamStr(p->pStrs, Func);
        // translate elementary gate
        int iFuncNew = Prs_ManIsVerilogPrim(Abc_NamStr(p->pStrs, Func));
        if ( iFuncNew == 0 )                return Prs_ManErrorSet(p, "Cannot find elementary gate.", 0);
        Func = iFuncNew;
        Status = Prs_ManReadSignalList( p, &p->vTemp, ')', 1 );
    }
    if ( Status == 0 )                      return Prs_ManErrorSet(p, "Error number 28.", 0);
    assert( Prs_ManIsChar(p, ')') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 29.", 0);
    if ( !Prs_ManIsChar(p, ';') )           return Prs_ManErrorSet(p, "Expecting semicolon in the instance.", 0);
    // add box 
    Prs_NtkAddBox( p->pNtk, Func, InstId, &p->vTemp );
    return 1;
}